

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>::destroy
          (AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> *this)

{
  TimerImpl::TimerPromiseAdapter::~TimerPromiseAdapter(&this->adapter);
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<void>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }